

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less::operator()
          (void *this,char (*t) [5],
          reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *u)

{
  bool bVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  sVar2 = strlen(*t);
  __y._M_str = (u->_M_data->_M_dataplus)._M_p;
  __y._M_len = u->_M_data->_M_string_length;
  __x._M_str = *t;
  __x._M_len = sVar2;
  bVar1 = std::operator<(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const T& t, const U& u) const {
      return ImplicitConvert(t) < ImplicitConvert(u);
    }